

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cookie.c
# Opt level: O2

int mbedtls_ssl_cookie_write(void *p_ctx,uchar **p,uchar *end,uchar *cli_id,size_t cli_id_len)

{
  uchar *time;
  int iVar1;
  time_t tVar2;
  
  iVar1 = -0x7100;
  if ((cli_id != (uchar *)0x0 && p_ctx != (void *)0x0) &&
     (iVar1 = -0x6a00, 0x1f < (ulong)((long)end - (long)*p))) {
    tVar2 = ::time((time_t *)0x0);
    **p = (uchar)((ulong)tVar2 >> 0x18);
    (*p)[1] = (uchar)((ulong)tVar2 >> 0x10);
    (*p)[2] = (uchar)((ulong)tVar2 >> 8);
    (*p)[3] = (uchar)tVar2;
    time = *p;
    *p = time + 4;
    iVar1 = ssl_cookie_hmac((mbedtls_md_context_t *)p_ctx,time,p,end,cli_id,cli_id_len);
    return iVar1;
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_cookie_write( void *p_ctx,
                      unsigned char **p, unsigned char *end,
                      const unsigned char *cli_id, size_t cli_id_len )
{
    int ret;
    mbedtls_ssl_cookie_ctx *ctx = (mbedtls_ssl_cookie_ctx *) p_ctx;
    unsigned long t;

    if( ctx == NULL || cli_id == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    if( (size_t)( end - *p ) < COOKIE_LEN )
        return( MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL );

#if defined(MBEDTLS_HAVE_TIME)
    t = (unsigned long) mbedtls_time( NULL );
#else
    t = ctx->serial++;
#endif

    (*p)[0] = (unsigned char)( t >> 24 );
    (*p)[1] = (unsigned char)( t >> 16 );
    (*p)[2] = (unsigned char)( t >>  8 );
    (*p)[3] = (unsigned char)( t       );
    *p += 4;

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR + ret );
#endif

    ret = ssl_cookie_hmac( &ctx->hmac_ctx, *p - 4,
                           p, end, cli_id, cli_id_len );

#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR +
                MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}